

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

texts * __thiscall
lest::make_texts<char_const*[2]>(texts *__return_storage_ptr__,lest *this,char *(*c) [2])

{
  lest *this_00;
  char **first;
  char **in_RCX;
  texts local_30;
  lest *local_18;
  char *(*c_local) [2];
  
  local_18 = this;
  c_local = (char *(*) [2])__return_storage_ptr__;
  this_00 = (lest *)text_begin<char_const*[2]>((char *(*) [2])this);
  first = text_end<char_const*[2]>((char *(*) [2])local_18);
  make_texts_abi_cxx11_(&local_30,this_00,first,in_RCX);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

tests make_tests( C const & c ) { return make_tests( test_begin( c ), test_end( c ) ); }